

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns_Switch.c
# Opt level: O1

int runCVode(void *cvode_mem,N_Vector y,N_Vector *yS,UserData data)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long netfS;
  long ncfnS;
  long nniS;
  long nsetupsS;
  long nfeS;
  long nfSe;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  sunrealtype t;
  long nfeD;
  long njeD;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 local_30;
  
  printf("Sensitivity: ");
  if (*(int *)yS == 0) {
    pcVar3 = "NO";
  }
  else {
    printf("YES (");
    uVar1 = *(int *)((long)yS + 0xc) - 1;
    if (uVar1 < 3) {
      printf(&DAT_0010446c + *(int *)(&DAT_0010446c + (ulong)uVar1 * 4));
    }
    pcVar3 = "FULL ERROR CONTROL + ";
    if (*(int *)((long)yS + 4) == 0) {
      pcVar3 = "PARTIAL ERROR CONTROL + ";
    }
    printf(pcVar3);
    pcVar3 = "DQ sensitivity RHS)";
    if (*(int *)(yS + 1) == 0) {
      pcVar3 = "user-provided sensitivity RHS)";
    }
  }
  puts(pcVar3);
  printf("Parameters: [%8.4e  %8.4e  %8.4e]\n",yS[2],yS[3],yS[4]);
  iVar2 = CVode(0x4222a05f20000000,cvode_mem,y,local_40,1);
  if (iVar2 == 0) {
    CVodeGetNumSteps(cvode_mem,&local_48);
    CVodeGetNumRhsEvals(cvode_mem,&local_50);
    CVodeGetNumLinSolvSetups(cvode_mem,&local_58);
    CVodeGetNumErrTestFails(cvode_mem,&local_70);
    CVodeGetNumNonlinSolvIters(cvode_mem,&local_60);
    CVodeGetNumNonlinSolvConvFails(cvode_mem,&local_68);
    if (*(int *)yS != 0) {
      CVodeGetSensNumRhsEvals(cvode_mem,&local_78);
      CVodeGetNumRhsEvalsSens(cvode_mem,&local_80);
      CVodeGetSensNumLinSolvSetups(cvode_mem,&local_88);
      if (*(int *)((long)yS + 4) == 0) {
        local_a0 = 0;
      }
      else {
        CVodeGetSensNumErrTestFails(cvode_mem,&local_a0);
      }
      if (*(int *)((long)yS + 0xc) == 2) {
        CVodeGetSensNumNonlinSolvIters(cvode_mem,&local_90);
        CVodeGetSensNumNonlinSolvConvFails(cvode_mem,&local_98);
      }
      else {
        local_90 = 0;
        local_98 = 0;
      }
    }
    CVodeGetNumJacEvals(cvode_mem,&local_30);
    iVar2 = CVodeGetNumLinRhsEvals(cvode_mem,&local_38);
    puts("Run statistics:");
    printf("   nst     = %5ld\n",local_48);
    printf("   nfe     = %5ld\n",local_50);
    printf("   netf    = %5ld    nsetups  = %5ld\n",local_70,local_58);
    printf("   nni     = %5ld    ncfn     = %5ld\n",local_60,local_68);
    printf("   njeD    = %5ld    nfeD     = %5ld\n",local_30,local_38);
    if (*(int *)yS != 0) {
      puts("   -----------------------------------");
      printf("   nfSe    = %5ld    nfeS     = %5ld\n",local_78,local_80);
      printf("   netfs   = %5ld    nsetupsS = %5ld\n",local_a0,local_88);
      printf("   nniS    = %5ld    ncfnS    = %5ld\n",local_90,local_98);
    }
    putchar(10);
  }
  return iVar2;
}

Assistant:

static int runCVode(void* cvode_mem, N_Vector y, N_Vector* yS, UserData data)
{
  sunrealtype t;
  int retval;

  /* Print header for current run */
  PrintHeader(data);

  /* Call CVode in CV_NORMAL mode */
  retval = CVode(cvode_mem, T1, y, &t, CV_NORMAL);
  if (retval != 0) { return (retval); }

  /* Print final statistics */
  retval = PrintFinalStats(cvode_mem, data);
  printf("\n");

  return (retval);
}